

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

int kiss_fft_next_fast_size(int n)

{
  undefined4 local_10;
  undefined4 local_c;
  int m;
  int n_local;
  
  local_c = n;
  while( true ) {
    for (local_10 = local_c; local_10 % 2 == 0; local_10 = local_10 / 2) {
    }
    for (; local_10 % 3 == 0; local_10 = local_10 / 3) {
    }
    for (; local_10 % 5 == 0; local_10 = local_10 / 5) {
    }
    if (local_10 < 2) break;
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int kiss_fft_next_fast_size(int n)
{
    while(1) {
        int m=n;
        while ( (m%2) == 0 ) m/=2;
        while ( (m%3) == 0 ) m/=3;
        while ( (m%5) == 0 ) m/=5;
        if (m<=1)
            break; /* n is completely factorable by twos, threes, and fives */
        n++;
    }
    return n;
}